

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::sampleTextureBorder<float>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  TextureChannelClass TVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar2;
  Vector<float,_4> VVar3;
  tcu local_30 [16];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  
  TVar1 = getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(local_30,format,sampler);
    VVar2 = Vector<float,_4>::cast<float>((Vector<float,_4> *)this);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(local_30,format,sampler);
    VVar2 = Vector<int,_4>::cast<float>((Vector<int,_4> *)this);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(local_30,format,sampler);
    VVar2 = Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this);
    VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar3.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}